

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void idwpt_sym(wpt_object wt,double *cA,int len_cA,double *cD,double *X)

{
  int iVar1;
  int iVar2;
  wave_object pwVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  
  pwVar3 = wt->wave;
  iVar1 = pwVar3->hpr_len;
  iVar2 = pwVar3->lpr_len;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < len_cA) {
    uVar8 = (ulong)(uint)len_cA;
  }
  lVar9 = -2;
  lVar6 = -1;
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    X[lVar9 + 2] = 0.0;
    X[lVar6 + 2] = 0.0;
    lVar9 = lVar9 + 2;
    lVar6 = lVar6 + 2;
    dVar13 = 0.0;
    lVar10 = 1;
    dVar14 = 0.0;
    uVar12 = uVar7;
    for (lVar11 = 0; lVar11 < (iVar1 + iVar2) / 4; lVar11 = lVar11 + 1) {
      if ((long)uVar12 < (long)len_cA && -1 < (long)uVar12) {
        pdVar4 = pwVar3->lpr;
        pdVar5 = pwVar3->hpr;
        dVar14 = dVar14 + pdVar4[lVar10 + -1] * cA[uVar12] + pdVar5[lVar10 + -1] * cD[uVar12];
        X[lVar9] = dVar14;
        dVar13 = dVar13 + pdVar4[lVar10] * cA[uVar12] + pdVar5[lVar10] * cD[uVar12];
        X[lVar6] = dVar13;
      }
      lVar10 = lVar10 + 2;
      uVar12 = uVar12 - 1;
    }
  }
  return;
}

Assistant:

static void idwpt_sym(wpt_object wt, double *cA, int len_cA, double *cD, double *X) {
	int len_avg, i, l, m, n, t, v;

	len_avg = (wt->wave->lpr_len + wt->wave->hpr_len) / 2;
	m = -2;
	n = -1;

	for (v = 0; v < len_cA; ++v) {
		i = v;
		m += 2;
		n += 2;
		X[m] = 0.0;
		X[n] = 0.0;
		for (l = 0; l < len_avg / 2; ++l) {
			t = 2 * l;
			if ((i - l) >= 0 && (i - l) < len_cA) {
				X[m] += wt->wave->lpr[t] * cA[i - l] + wt->wave->hpr[t] * cD[i - l];
				X[n] += wt->wave->lpr[t + 1] * cA[i - l] + wt->wave->hpr[t + 1] * cD[i - l];
			}
		}
	}
}